

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

void __thiscall lan::db::erase_bit(db *this,db_bit *bit)

{
  db_bit *local_30;
  db_bit *local_28;
  db_bit *bit_local;
  db *this_local;
  
  if (bit != (db_bit *)0x0) {
    if (bit->pre == (db_bit *)0x0) {
      if (bit->con != (db_bit *)0x0) {
        bit->con->lin = bit->nex;
      }
    }
    else {
      bit->pre->nex = bit->nex;
    }
    if (bit == this->first) {
      local_28 = this->first->nex;
    }
    else {
      local_28 = this->first;
    }
    this->first = local_28;
    if (bit == this->last) {
      local_30 = this->last->pre;
    }
    else {
      local_30 = this->last;
    }
    this->last = local_30;
    if (bit->lin != (db_bit *)0x0) {
      erase_bits(this,bit->lin);
    }
    if (bit != (db_bit *)0x0) {
      db_bit::~db_bit(bit);
      operator_delete(bit,0x50);
    }
  }
  return;
}

Assistant:

void db::erase_bit(db_bit * bit){
            if(bit){
                if(bit->pre)
                    bit->pre->nex = bit->nex;
                else if(bit->con)
                    bit->con->lin = bit->nex;
                first = (bit == first) ? first->nex : first ;
                last = (bit == last) ? last->pre : last;
                if(bit->lin)
                    erase_bits(bit->lin);
                delete bit;
                bit = nullptr;
            }
        }